

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddIAdd
          (InstructionBuilder *this,uint32_t type,uint32_t op1,uint32_t op2)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  Instruction *pIVar1;
  IRContext *c;
  IRContext *this_00;
  Operand *local_138;
  allocator<spvtools::opt::Operand> local_12d;
  uint32_t local_12c;
  iterator local_128;
  undefined8 local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  uint32_t local_ec;
  iterator local_e8;
  undefined8 local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  Operand local_b0;
  Operand OStack_80;
  iterator local_50;
  _func_int **local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> inst;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t type_local;
  InstructionBuilder *this_local;
  
  inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = op2;
  pIVar1 = (Instruction *)operator_new(0x70);
  c = GetContext(this);
  this_00 = GetContext(this);
  res_id = IRContext::TakeNextId(this_00);
  local_e8 = &local_ec;
  local_e0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_e8;
  local_ec = op1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_00);
  Operand::Operand(&local_b0,SPV_OPERAND_TYPE_ID,&local_d8);
  local_12c = inst._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_128 = &local_12c;
  local_120 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_128;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list);
  Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_ID,&local_118);
  local_50 = &local_b0;
  local_48 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_12d);
  __l._M_len = (size_type)local_48;
  __l._M_array = local_50;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_40,__l,&local_12d);
  Instruction::Instruction(pIVar1,c,OpIAdd,type,res_id,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_12d);
  local_138 = (Operand *)&local_50;
  do {
    local_138 = local_138 + -1;
    Operand::~Operand(local_138);
  } while (local_138 != &local_b0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
  pIVar1 = AddInstruction(this,&local_28);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return pIVar1;
}

Assistant:

Instruction* AddIAdd(uint32_t type, uint32_t op1, uint32_t op2) {
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> inst(new Instruction(
        GetContext(), spv::Op::OpIAdd, type, GetContext()->TakeNextId(),
        {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}}));
    return AddInstruction(std::move(inst));
  }